

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateSerializedSizeCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "for (java.util.Map.Entry<$type_parameters$> entry\n     : internalGet$capitalized_name$().getMap().entrySet()) {\n  com.google.protobuf.MapEntry<$type_parameters$>\n  $name$__ = $default_entry$.newBuilderForType()\n      .setKey(entry.getKey())\n      .setValue(entry.getValue())\n      .build();\n  size += com.google.protobuf.CodedOutputStream\n      .computeMessageSize($number$, $name$__);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "for (java.util.Map.Entry<$type_parameters$> entry\n"
      "     : internalGet$capitalized_name$().getMap().entrySet()) {\n"
      "  com.google.protobuf.MapEntry<$type_parameters$>\n"
      "  $name$__ = $default_entry$.newBuilderForType()\n"
      "      .setKey(entry.getKey())\n"
      "      .setValue(entry.getValue())\n"
      "      .build();\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeMessageSize($number$, $name$__);\n"
      "}\n");
}